

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_inv_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *N)

{
  int iVar1;
  undefined1 local_108 [8];
  mbedtls_mpi V2;
  mbedtls_mpi V1;
  mbedtls_mpi TV;
  mbedtls_mpi TB;
  mbedtls_mpi U2;
  mbedtls_mpi U1;
  mbedtls_mpi TU;
  mbedtls_mpi TA;
  mbedtls_mpi G;
  int ret;
  mbedtls_mpi *N_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  iVar1 = mbedtls_mpi_cmp_int(N,0);
  if (iVar1 < 1) {
    return -4;
  }
  mbedtls_mpi_init((mbedtls_mpi *)&TU.p);
  mbedtls_mpi_init((mbedtls_mpi *)&U1.p);
  mbedtls_mpi_init((mbedtls_mpi *)&U2.p);
  mbedtls_mpi_init((mbedtls_mpi *)&TB.p);
  mbedtls_mpi_init((mbedtls_mpi *)&TA.p);
  mbedtls_mpi_init((mbedtls_mpi *)&TV.p);
  mbedtls_mpi_init((mbedtls_mpi *)&V1.p);
  mbedtls_mpi_init((mbedtls_mpi *)&V2.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_108);
  G.p._4_4_ = mbedtls_mpi_gcd((mbedtls_mpi *)&TA.p,A,N);
  if (G.p._4_4_ == 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&TA.p,1);
    if (iVar1 == 0) {
      G.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&TU.p,A,N);
      if (((((G.p._4_4_ == 0) &&
            (G.p._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&U1.p,(mbedtls_mpi *)&TU.p), G.p._4_4_ == 0
            )) && (G.p._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&TV.p,N), G.p._4_4_ == 0)) &&
          ((G.p._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&V1.p,N), G.p._4_4_ == 0 &&
           (G.p._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&U2.p,1), G.p._4_4_ == 0)))) &&
         ((G.p._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&TB.p,0), G.p._4_4_ == 0 &&
          ((G.p._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&V2.p,0), G.p._4_4_ == 0 &&
           (G.p._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)local_108,1), G.p._4_4_ == 0)))))) {
        do {
          while ((*(ulong *)TU.n & 1) == 0) {
            G.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&U1.p,1);
            if (((G.p._4_4_ != 0) ||
                ((((*(ulong *)U1.n & 1) != 0 || ((*(ulong *)U2.n & 1) != 0)) &&
                 ((G.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&U2.p,(mbedtls_mpi *)&U2.p,
                                                   (mbedtls_mpi *)&TV.p), G.p._4_4_ != 0 ||
                  (G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&TB.p,(mbedtls_mpi *)&TB.p,
                                                   (mbedtls_mpi *)&TU.p), G.p._4_4_ != 0)))))) ||
               ((G.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&U2.p,1), G.p._4_4_ != 0 ||
                (G.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&TB.p,1), G.p._4_4_ != 0))))
            goto LAB_001abd35;
          }
          while ((*(ulong *)TV.n & 1) == 0) {
            G.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&V1.p,1);
            if ((G.p._4_4_ != 0) ||
               (((((*(ulong *)V1.n & 1) != 0 || ((*(ulong *)V2.n & 1) != 0)) &&
                 ((G.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&V2.p,(mbedtls_mpi *)&V2.p,
                                                   (mbedtls_mpi *)&TV.p), G.p._4_4_ != 0 ||
                  (G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_108,(mbedtls_mpi *)local_108
                                                   ,(mbedtls_mpi *)&TU.p), G.p._4_4_ != 0)))) ||
                ((G.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&V2.p,1), G.p._4_4_ != 0 ||
                 (G.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_108,1), G.p._4_4_ != 0))))))
            goto LAB_001abd35;
          }
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&U1.p,(mbedtls_mpi *)&V1.p);
          if (iVar1 < 0) {
            G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&V1.p,(mbedtls_mpi *)&V1.p,
                                            (mbedtls_mpi *)&U1.p);
            if ((G.p._4_4_ != 0) ||
               (G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&V2.p,(mbedtls_mpi *)&V2.p,
                                                (mbedtls_mpi *)&U2.p), G.p._4_4_ != 0)) break;
            G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_108,(mbedtls_mpi *)local_108,
                                            (mbedtls_mpi *)&TB.p);
          }
          else {
            G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&U1.p,(mbedtls_mpi *)&U1.p,
                                            (mbedtls_mpi *)&V1.p);
            if ((G.p._4_4_ != 0) ||
               (G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&U2.p,(mbedtls_mpi *)&U2.p,
                                                (mbedtls_mpi *)&V2.p), G.p._4_4_ != 0)) break;
            G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&TB.p,(mbedtls_mpi *)&TB.p,
                                            (mbedtls_mpi *)local_108);
          }
          if (G.p._4_4_ != 0) break;
          iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&U1.p,0);
          if (iVar1 == 0) goto LAB_001abca3;
        } while( true );
      }
    }
    else {
      G.p._4_4_ = -0xe;
    }
  }
  goto LAB_001abd35;
  while (G.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&V2.p,(mbedtls_mpi *)&V2.p,N),
        G.p._4_4_ == 0) {
LAB_001abca3:
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&V2.p,0);
    if (-1 < iVar1) goto LAB_001abcdd;
  }
  goto LAB_001abd35;
  while (G.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&V2.p,(mbedtls_mpi *)&V2.p,N),
        G.p._4_4_ == 0) {
LAB_001abcdd:
    iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&V2.p,N);
    if (iVar1 < 0) {
      G.p._4_4_ = mbedtls_mpi_copy(X,(mbedtls_mpi *)&V2.p);
      break;
    }
  }
LAB_001abd35:
  mbedtls_mpi_free((mbedtls_mpi *)&TU.p);
  mbedtls_mpi_free((mbedtls_mpi *)&U1.p);
  mbedtls_mpi_free((mbedtls_mpi *)&U2.p);
  mbedtls_mpi_free((mbedtls_mpi *)&TB.p);
  mbedtls_mpi_free((mbedtls_mpi *)&TA.p);
  mbedtls_mpi_free((mbedtls_mpi *)&TV.p);
  mbedtls_mpi_free((mbedtls_mpi *)&V1.p);
  mbedtls_mpi_free((mbedtls_mpi *)&V2.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_108);
  return G.p._4_4_;
}

Assistant:

int mbedtls_mpi_inv_mod( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *N )
{
    int ret;
    mbedtls_mpi G, TA, TU, U1, U2, TB, TV, V1, V2;

    if( mbedtls_mpi_cmp_int( N, 0 ) <= 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TU ); mbedtls_mpi_init( &U1 ); mbedtls_mpi_init( &U2 );
    mbedtls_mpi_init( &G ); mbedtls_mpi_init( &TB ); mbedtls_mpi_init( &TV );
    mbedtls_mpi_init( &V1 ); mbedtls_mpi_init( &V2 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, A, N ) );

    if( mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
    {
        ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &TA, A, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TU, &TA ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TV, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U1, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U2, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V1, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V2, 1 ) );

    do
    {
        while( ( TU.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TU, 1 ) );

            if( ( U1.p[0] & 1 ) != 0 || ( U2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &U1, &U1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U2, 1 ) );
        }

        while( ( TV.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TV, 1 ) );

            if( ( V1.p[0] & 1 ) != 0 || ( V2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V2, 1 ) );
        }

        if( mbedtls_mpi_cmp_mpi( &TU, &TV ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TU, &TU, &TV ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U1, &U1, &V1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &V2 ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TV, &TV, &TU ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, &U1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &U2 ) );
        }
    }
    while( mbedtls_mpi_cmp_int( &TU, 0 ) != 0 );

    while( mbedtls_mpi_cmp_int( &V1, 0 ) < 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, N ) );

    while( mbedtls_mpi_cmp_mpi( &V1, N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, &V1 ) );

cleanup:

    mbedtls_mpi_free( &TA ); mbedtls_mpi_free( &TU ); mbedtls_mpi_free( &U1 ); mbedtls_mpi_free( &U2 );
    mbedtls_mpi_free( &G ); mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TV );
    mbedtls_mpi_free( &V1 ); mbedtls_mpi_free( &V2 );

    return( ret );
}